

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

size_t fiobj_str_printf(FIOBJ dest,char *format,...)

{
  size_t sVar1;
  undefined1 local_50 [8];
  fio_str_info_s state;
  va_list argv;
  char *format_local;
  FIOBJ dest_local;
  
  sVar1 = fiobj_type_is(dest,FIOBJ_T_STRING);
  if (sVar1 != 0) {
    if (*(char *)((dest & 0xfffffffffffffff8) + 0x11) == '\0') {
      *(undefined8 *)((dest & 0xfffffffffffffff8) + 8) = 0;
      state.data._4_4_ = 0x30;
      state.data._0_4_ = 0x10;
      fio_str_vprintf((fio_str_info_s *)local_50,
                      (fio_str_s_conflict *)((dest & 0xfffffffffffffff8) + 0x10),format,
                      (__va_list_tag *)&state.data);
      dest_local = state.capa;
    }
    else {
      dest_local = 0;
    }
    return dest_local;
  }
  __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                ,0x10f,"size_t fiobj_str_printf(FIOBJ, const char *, ...)");
}

Assistant:

size_t fiobj_str_printf(FIOBJ dest, const char *format, ...) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  va_list argv;
  va_start(argv, format);
  fio_str_info_s state = fio_str_vprintf(&obj2str(dest)->str, format, argv);
  va_end(argv);
  return state.len;
}